

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_disposition(AMQP_VALUE value,DISPOSITION_HANDLE *disposition_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  _Bool local_4e;
  _Bool local_4d;
  uint32_t local_4c;
  _Bool batchable;
  _Bool settled;
  delivery_number last;
  delivery_number first;
  role role;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  DISPOSITION_INSTANCE *disposition_instance;
  DISPOSITION_HANDLE *ppDStack_18;
  int result;
  DISPOSITION_HANDLE *disposition_handle_local;
  AMQP_VALUE value_local;
  
  ppDStack_18 = disposition_handle;
  disposition_handle_local = (DISPOSITION_HANDLE *)value;
  list_value = (AMQP_VALUE)disposition_create_internal();
  *ppDStack_18 = (DISPOSITION_HANDLE)list_value;
  if (*ppDStack_18 == (DISPOSITION_HANDLE)0x0) {
    disposition_instance._4_4_ = 0x209d;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)disposition_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      disposition_destroy(*ppDStack_18);
      disposition_instance._4_4_ = 0x20a5;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          disposition_instance._4_4_ = 0x20d9;
        }
        else {
          _first = amqpvalue_get_list_item(pAStack_30,0);
          if (_first == (AMQP_VALUE)0x0) {
            disposition_destroy(*ppDStack_18);
            disposition_instance._4_4_ = 0x20bb;
          }
          else {
            AVar2 = amqpvalue_get_type(_first);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(_first);
              disposition_destroy(*ppDStack_18);
              disposition_instance._4_4_ = 0x20c5;
            }
            else {
              iVar1 = amqpvalue_get_boolean(_first,(_Bool *)((long)&last + 3));
              if (iVar1 == 0) {
                amqpvalue_destroy(_first);
                if (item_value._4_4_ < 2) {
                  disposition_instance._4_4_ = 0x2102;
                }
                else {
                  _first = amqpvalue_get_list_item(pAStack_30,1);
                  if (_first == (AMQP_VALUE)0x0) {
                    disposition_destroy(*ppDStack_18);
                    disposition_instance._4_4_ = 0x20e4;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(_first);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(_first);
                      disposition_destroy(*ppDStack_18);
                      disposition_instance._4_4_ = 0x20ee;
                    }
                    else {
                      iVar1 = amqpvalue_get_uint(_first,(uint32_t *)&stack0xffffffffffffffb8);
                      if (iVar1 == 0) {
                        amqpvalue_destroy(_first);
                        if ((2 < item_value._4_4_) &&
                           (_first = amqpvalue_get_list_item(pAStack_30,2),
                           _first != (AMQP_VALUE)0x0)) {
                          AVar2 = amqpvalue_get_type(_first);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar1 = amqpvalue_get_uint(_first,&local_4c), iVar1 != 0)) {
                            amqpvalue_destroy(_first);
                            disposition_destroy(*ppDStack_18);
                            return 0x211a;
                          }
                          amqpvalue_destroy(_first);
                        }
                        if ((3 < item_value._4_4_) &&
                           (_first = amqpvalue_get_list_item(pAStack_30,3),
                           _first != (AMQP_VALUE)0x0)) {
                          AVar2 = amqpvalue_get_type(_first);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar1 = amqpvalue_get_boolean(_first,&local_4d), iVar1 != 0)) {
                            amqpvalue_destroy(_first);
                            disposition_destroy(*ppDStack_18);
                            return 0x2137;
                          }
                          amqpvalue_destroy(_first);
                        }
                        if ((4 < item_value._4_4_) &&
                           (_first = amqpvalue_get_list_item(pAStack_30,4),
                           _first != (AMQP_VALUE)0x0)) {
                          amqpvalue_destroy(_first);
                        }
                        if ((5 < item_value._4_4_) &&
                           (_first = amqpvalue_get_list_item(pAStack_30,5),
                           _first != (AMQP_VALUE)0x0)) {
                          AVar2 = amqpvalue_get_type(_first);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar1 = amqpvalue_get_boolean(_first,&local_4e), iVar1 != 0)) {
                            amqpvalue_destroy(_first);
                            disposition_destroy(*ppDStack_18);
                            return 0x2161;
                          }
                          amqpvalue_destroy(_first);
                        }
                        pAVar3 = amqpvalue_clone((AMQP_VALUE)disposition_handle_local);
                        *(AMQP_VALUE *)list_value = pAVar3;
                        disposition_instance._4_4_ = 0;
                      }
                      else {
                        amqpvalue_destroy(_first);
                        disposition_destroy(*ppDStack_18);
                        disposition_instance._4_4_ = 0x20f8;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(_first);
                disposition_destroy(*ppDStack_18);
                disposition_instance._4_4_ = 0x20cf;
              }
            }
          }
        }
      }
      else {
        disposition_instance._4_4_ = 0x20ac;
      }
    }
  }
  return disposition_instance._4_4_;
}

Assistant:

int amqpvalue_get_disposition(AMQP_VALUE value, DISPOSITION_HANDLE* disposition_handle)
{
    int result;
    DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition_create_internal();
    *disposition_handle = disposition_instance;
    if (*disposition_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            disposition_destroy(*disposition_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* role */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                role role;
                                if (amqpvalue_get_role(item_value, &role) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* first */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                delivery_number first;
                                if (amqpvalue_get_delivery_number(item_value, &first) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* last */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                delivery_number last;
                                if (amqpvalue_get_delivery_number(item_value, &last) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* settled */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool settled;
                                if (amqpvalue_get_boolean(item_value, &settled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* state */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* batchable */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool batchable;
                                if (amqpvalue_get_boolean(item_value, &batchable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    disposition_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}